

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_namer.h
# Opt level: O0

string * __thiscall
flatbuffers::IdlNamer::Field(string *__return_storage_ptr__,IdlNamer *this,FieldDef *d,string *s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *s_local;
  FieldDef *d_local;
  IdlNamer *this_local;
  
  local_28 = s;
  s_local = (string *)d;
  d_local = (FieldDef *)this;
  this_local = (IdlNamer *)__return_storage_ptr__;
  std::operator+(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)d,
                 "_");
  std::operator+(&local_48,&local_68,local_28);
  (*(this->super_Namer)._vptr_Namer[0x12])(__return_storage_ptr__,this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string Field(const FieldDef &d, const std::string &s) const {
    return Field(d.name + "_" + s);
  }